

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_typed_array(basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                    *this,span<const_short,_18446744073709551615UL> *data,semantic_tag tag,
                   ser_context *context,error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  uchar *__dest;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  ser_context *psVar4;
  undefined1 in_DL;
  span<const_short,_18446744073709551615UL> *in_RSI;
  basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
  *in_RDI;
  basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
  *in_R8;
  const_iterator p;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  ser_context *in_stack_ffffffffffffff48;
  ser_context *context_00;
  basic_json_visitor<char> *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  allocator_type *in_stack_ffffffffffffff60;
  byte_string_view *this_00;
  ser_context *local_80;
  undefined1 local_51 [25];
  byte_string_view *in_stack_ffffffffffffffc8;
  
  bVar1 = cbor_encode_options::use_typed_arrays(&in_RDI->options_);
  if (bVar1) {
    write_typed_array_tag(in_RDI,0,in_DL);
    sVar2 = jsoncons::detail::span<const_short,_18446744073709551615UL>::size(in_RSI);
    sVar2 = sVar2 * 2;
    pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_51;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x297f57);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (pvVar3,sVar2,in_stack_ffffffffffffff60);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x297f77);
    this_00 = (byte_string_view *)(local_51 + 1);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x297f86);
    pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             jsoncons::detail::span<const_short,_18446744073709551615UL>::data(in_RSI);
    sVar2 = jsoncons::detail::span<const_short,_18446744073709551615UL>::size(in_RSI);
    memcpy(__dest,pvVar3,sVar2 * 2);
    byte_string_view::byte_string_view<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (this_00,pvVar3,(type_conflict)((ulong)__dest >> 0x20));
    write_byte_string(in_R8,in_stack_ffffffffffffffc8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  }
  else {
    jsoncons::detail::span<const_short,_18446744073709551615UL>::size(in_RSI);
    basic_json_visitor<char>::begin_array
              ((basic_json_visitor<char> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (semantic_tag)((ulong)in_stack_ffffffffffffff50 >> 0x38),in_stack_ffffffffffffff48,
               (error_code *)0x298060);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_R8);
    if (!bVar1) {
      local_80 = (ser_context *)
                 jsoncons::detail::span<const_short,_18446744073709551615UL>::begin(in_RSI);
      while (context_00 = local_80,
            psVar4 = (ser_context *)
                     jsoncons::detail::span<const_short,_18446744073709551615UL>::end(in_RSI),
            context_00 != psVar4) {
        basic_json_visitor<char>::int64_value
                  ((basic_json_visitor<char> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (semantic_tag)((ulong)in_stack_ffffffffffffff50 >> 0x38),context_00,
                   (error_code *)0x2980dd);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_R8);
        if (bVar1) {
          return true;
        }
        local_80 = (ser_context *)((long)&local_80->_vptr_ser_context + 2);
      }
      basic_json_visitor<char>::end_array
                (in_stack_ffffffffffffff50,context_00,(error_code *)0x29812a);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const int16_t>& data,  
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        if (options_.use_typed_arrays())
        {
            write_typed_array_tag(std::integral_constant<bool, jsoncons::endian::native == jsoncons::endian::big>(), 
                                  int16_t(), 
                                  tag);
            std::vector<uint8_t> v(data.size()*sizeof(int16_t));
            std::memcpy(v.data(), data.data(), data.size()*sizeof(int16_t));
            write_byte_string(byte_string_view(v));
            JSONCONS_VISITOR_RETURN;
        }
        else
        {
            this->begin_array(data.size(), semantic_tag::none,context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = data.begin(); p != data.end(); ++p)
            {
                this->int64_value(*p,semantic_tag::none,context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            this->end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }
    }